

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_allocator.h
# Opt level: O0

pointer __thiscall
util::AlignedAllocator<math::Vector<float,_64>,_16UL>::allocate
          (AlignedAllocator<math::Vector<float,_64>,_16UL> *this,size_type n)

{
  int iVar1;
  size_type sVar2;
  bad_alloc *pbVar3;
  pointer local_28;
  pointer p;
  size_t size;
  size_type n_local;
  AlignedAllocator<math::Vector<float,_64>,_16UL> *this_local;
  
  size = n;
  n_local = (size_type)this;
  sVar2 = max_size(this);
  if (sVar2 < n) {
    pbVar3 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(pbVar3);
    __cxa_throw(pbVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  p = (pointer)(size << 8);
  local_28 = (pointer)0x0;
  iVar1 = posix_memalign(&local_28,0x10,(size_t)p);
  if (iVar1 != 0) {
    pbVar3 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(pbVar3);
    __cxa_throw(pbVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return local_28;
}

Assistant:

inline typename AlignedAllocator<T, alignment>::pointer
AlignedAllocator<T, alignment>::allocate (size_type n)
{
    if (n > this->max_size())
      throw std::bad_alloc();
    size_t size = n * sizeof(T);
    pointer p = nullptr;
#ifdef _WIN32
    p = reinterpret_cast<pointer>(::_aligned_malloc(size, alignment));
    if (p == nullptr)
        throw std::bad_alloc();
#else
    if (::posix_memalign(&reinterpret_cast<void*&>(p), alignment, size))
        throw std::bad_alloc();
#endif
    return p;
}